

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int unquantize_i1r8(long row,uchar *input,long ntodo,double scale,double zero,int dither_method,
                   int nullcheck,uchar tnull,double nullval,char *nullarray,int *anynull,
                   double *output,int *status)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  char in_R9B;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  int iseed;
  int nextrand;
  long ii;
  undefined7 in_stack_00000018;
  int local_58;
  int local_54;
  long local_50;
  int local_4;
  
  if ((fits_rand_value == (float *)0x0) && (iVar1 = fits_init_randoms(), iVar1 != 0)) {
    local_4 = 0x71;
  }
  else {
    local_58 = (int)((in_RDI + -1) % 10000);
    local_54 = (int)(fits_rand_value[local_58] * 500.0);
    if (in_R8D == 0) {
      for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
        *(double *)(CONCAT17(tnull,in_stack_00000018) + local_50 * 8) =
             (((double)*(byte *)(in_RSI + local_50) - (double)fits_rand_value[local_54]) + 0.5) *
             in_XMM0_Qa + in_XMM1_Qa;
        local_54 = local_54 + 1;
        if (local_54 == 10000) {
          local_58 = local_58 + 1;
          if (local_58 == 10000) {
            local_58 = 0;
          }
          local_54 = (int)(fits_rand_value[local_58] * 500.0);
        }
      }
    }
    else {
      for (local_50 = 0; local_50 < in_RDX; local_50 = local_50 + 1) {
        if (*(char *)(in_RSI + local_50) == in_R9B) {
          *(undefined4 *)nullval = 1;
          if (in_R8D == 1) {
            *(undefined8 *)(CONCAT17(tnull,in_stack_00000018) + local_50 * 8) = in_XMM2_Qa;
          }
          else {
            *(undefined1 *)(ii + local_50) = 1;
          }
        }
        else {
          *(double *)(CONCAT17(tnull,in_stack_00000018) + local_50 * 8) =
               (((double)*(byte *)(in_RSI + local_50) - (double)fits_rand_value[local_54]) + 0.5) *
               in_XMM0_Qa + in_XMM1_Qa;
        }
        local_54 = local_54 + 1;
        if (local_54 == 10000) {
          local_58 = local_58 + 1;
          if (local_58 == 10000) {
            local_58 = 0;
          }
          local_54 = (int)(fits_rand_value[local_58] * 500.0);
        }
      }
    }
    local_4 = *(int *)CONCAT44(dither_method,nullcheck);
  }
  return local_4;
}

Assistant:

static int unquantize_i1r8(long row, /* tile number = row number in table  */
            unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int dither_method,    /* I - dithering method to use             */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            double nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            double *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
    Unquantize byte values into the scaled floating point values
*/
{
    long ii;
    int nextrand, iseed;

    if (!fits_rand_value) 
       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

    /* initialize the index to the next random number in the list */
    iseed = (int) ((row - 1) % N_RANDOM);
    nextrand = (int) (fits_rand_value[iseed] * 500);

    if (nullcheck == 0)     /* no null checking required */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
/*
                if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		    output[ii] = 0.0;
		else
*/
                    output[ii] = (double) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }
    else        /* must check for null values */
    {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
/*
                    if (dither_method == SUBTRACTIVE_DITHER_2 && input[ii] == ZERO_VALUE)
		        output[ii] = 0.0;
		    else
*/
                        output[ii] = (double) (((double) input[ii] - fits_rand_value[nextrand] + 0.5) * scale + zero);
                }

	        nextrand++;
	        if (nextrand == N_RANDOM) {
	            iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
		    nextrand = (int) (fits_rand_value[iseed] * 500);
	        }
            }
    }

    return(*status);
}